

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<7>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  uint uVar1;
  undefined8 in_RAX;
  uint *puVar2;
  int index;
  RepeatedField<unsigned_int> *array;
  undefined8 uStack_38;
  
  if (0 < *field) {
    index = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT44(md->tag,(undefined4)uStack_38);
      PrimitiveTypeHelper<13>::Serialize((void *)((long)&uStack_38 + 4),output);
      puVar2 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
      uVar1 = *puVar2;
      puVar2 = (uint *)output->cur_;
      if ((output->impl_).end_ <= puVar2) {
        puVar2 = (uint *)io::EpsCopyOutputStream::EnsureSpaceFallback
                                   (&output->impl_,(uint8_t *)puVar2);
      }
      output->cur_ = (uint8_t *)puVar2;
      *puVar2 = uVar1;
      output->cur_ = (uint8_t *)(puVar2 + 1);
      index = index + 1;
    } while (index < *field);
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    typedef typename PrimitiveTypeHelper<type>::Type T;
    const RepeatedField<T>& array = Get<RepeatedField<T> >(field);
    for (int i = 0; i < array.size(); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<type>(&array[i], output);
    }
  }